

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownMessageSetItemsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  pointer pUVar1;
  uint8_t *puVar2;
  long lVar3;
  int i;
  long lVar4;
  UnknownField *this;
  
  lVar3 = 0;
  for (lVar4 = 0;
      pUVar1 = (unknown_fields->fields_).
               super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
               ._M_impl.super__Vector_impl_data._M_start,
      lVar4 < (int)((ulong)((long)(unknown_fields->fields_).
                                  super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar1) >> 4);
      lVar4 = lVar4 + 1) {
    if (*(int *)((long)&pUVar1->type_ + lVar3) == 3) {
      this = (UnknownField *)((long)&pUVar1->number_ + lVar3);
      puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
      puVar2[0] = '\v';
      puVar2[1] = '\x10';
      puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this->number_,puVar2 + 2);
      *puVar2 = '\x1a';
      puVar2 = UnknownField::InternalSerializeLengthDelimitedNoTag(this,puVar2 + 1,stream);
      puVar2 = io::EpsCopyOutputStream::EnsureSpace(stream,puVar2);
      *puVar2 = '\f';
      target = puVar2 + 1;
    }
    lVar3 = lVar3 + 0x10;
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownMessageSetItemsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    // The only unknown fields that are allowed to exist in a MessageSet are
    // messages, which are length-delimited.
    if (field.type() == UnknownField::TYPE_LENGTH_DELIMITED) {
      target = stream->EnsureSpace(target);
      // Start group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemStartTag, target);

      // Write type ID.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetTypeIdTag, target);
      target =
          io::CodedOutputStream::WriteVarint32ToArray(field.number(), target);

      // Write message.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetMessageTag, target);

      target = field.InternalSerializeLengthDelimitedNoTag(target, stream);

      target = stream->EnsureSpace(target);
      // End group.
      target = io::CodedOutputStream::WriteTagToArray(
          WireFormatLite::kMessageSetItemEndTag, target);
    }
  }

  return target;
}